

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxSerialize.cpp
# Opt level: O3

void __thiscall Jinx::Impl::BinaryReader::Read(BinaryReader *this,String *val)

{
  size_t *pos;
  size_type sVar1;
  size_t sVar2;
  char *__s;
  uint32_t length;
  char buffer [1024];
  uint local_42c;
  char local_428 [1032];
  
  pos = &this->m_pos;
  Buffer::Read((this->m_buffer).super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
               pos,&local_42c,4);
  if ((ulong)local_42c < 0x3ff) {
    Buffer::Read((this->m_buffer).super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,pos,local_428,(ulong)local_42c + 1);
    sVar1 = val->_M_string_length;
    sVar2 = strlen(local_428);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::_M_replace
              (val,0,sVar1,local_428,sVar2);
  }
  else {
    __s = (char *)MemAllocate((ulong)(local_42c + 2));
    Buffer::Read((this->m_buffer).super___shared_ptr<Jinx::Buffer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr,pos,__s,(ulong)(local_42c + 1));
    sVar1 = val->_M_string_length;
    sVar2 = strlen(__s);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::_M_replace
              (val,0,sVar1,__s,sVar2);
    MemFree(__s,(ulong)(local_42c + 1));
  }
  return;
}

Assistant:

inline_t void BinaryReader::Read(String * val)
	{
		uint32_t length;
		m_buffer->Read(&m_pos, &length, sizeof(length));
		if (length < (1024 - 1))
		{
			char buffer[1024];
			m_buffer->Read(&m_pos, buffer, length + 1);
			*val = buffer;
		}
		else
		{
			char * buffer = (char *)MemAllocate(length + 2);
			m_buffer->Read(&m_pos, buffer, length + 1);
			*val = buffer;
			MemFree(buffer, length + 1);
		}
	}